

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

bool __thiscall gl4cts::EnhancedLayouts::Utils::Variable::IsBlock(Variable *this)

{
  Interface *pIVar1;
  TestError *this_00;
  bool bVar2;
  
  if ((this->m_descriptor).m_type == BUILTIN) {
    bVar2 = false;
  }
  else {
    pIVar1 = (this->m_descriptor).field_9.m_interface;
    if (pIVar1 == (Interface *)0x0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Nullptr",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0xedc);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    bVar2 = pIVar1->m_type == BLOCK;
  }
  return bVar2;
}

Assistant:

bool Variable::IsBlock() const
{
	if (BUILTIN == m_descriptor.m_type)
	{
		return false;
	}

	const Interface* interface = m_descriptor.m_interface;
	if (0 == interface)
	{
		TCU_FAIL("Nullptr");
	}

	return (Interface::BLOCK == interface->m_type);
}